

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoberts_fp.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  long *retvalvalue;
  void *retvalvalue_00;
  void *retvalvalue_01;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  int retval;
  SUNContext sunctx;
  sunrealtype fnorm;
  void *local_50;
  long nni;
  undefined4 local_3c;
  long nfe;
  
  fnorm = 0.0;
  puts("Example problem from chemical kinetics solving");
  puts("the first time step in a Backward Euler solution for the");
  puts("following three rate equations:");
  puts("    dy1/dt = -.04*y1 + 1.e4*y2*y3");
  puts("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2");
  puts("    dy3/dt = 3.e2*(y2)^2");
  puts("on the interval from t = 0.0 to t = 0.1, with initial");
  puts("conditions: y1 = 1.0, y2 = y3 = 0.");
  puts("Solution method: Anderson accelerated fixed point iteration.");
  retval = SUNContext_Create(0,&sunctx);
  iVar6 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    retvalvalue = (long *)N_VNew_Serial(3,sunctx);
    iVar3 = check_retval(retvalvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      retvalvalue_00 = (void *)N_VNew_Serial(3,sunctx);
      iVar3 = check_retval(retvalvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        retvalvalue_01 = (void *)KINCreate(sunctx);
        local_50 = retvalvalue_01;
        iVar3 = check_retval(retvalvalue_01,"KINCreate",0);
        if (iVar3 == 0) {
          retval = KINSetMAA(retvalvalue_01,2);
          retval = KINInit(retvalvalue_01,funcRoberts,retvalvalue);
          iVar3 = check_retval(&retval,"KINInit",1);
          iVar6 = 1;
          if (iVar3 == 0) {
            retval = KINSetFuncNormTol(0xd9d7bdbb,retvalvalue_01);
            iVar3 = check_retval(&retval,"KINSetFuncNormTol",1);
            iVar6 = 1;
            if (iVar3 == 0) {
              N_VConst(0,retvalvalue);
              **(undefined8 **)(*retvalvalue + 0x10) = 0x3ff0000000000000;
              N_VConst(0,retvalvalue_00);
              retval = KINSol(retvalvalue_01,retvalvalue,3,retvalvalue_00,retvalvalue_00);
              iVar3 = check_retval(&retval,"KINSol",1);
              iVar6 = 1;
              if (iVar3 == 0) {
                retval = KINGetFuncNorm(retvalvalue_01,&fnorm);
                iVar3 = check_retval(&retval,"KINGetfuncNorm",1);
                iVar6 = 1;
                if (iVar3 == 0) {
                  printf("\nComputed solution (||F|| = %g):\n\n",SUB84(fnorm,0));
                  puVar1 = *(undefined8 **)(*retvalvalue + 0x10);
                  printf("y =%14.6e  %14.6e  %14.6e\n",(int)*puVar1,puVar1[1],puVar1[2]);
                  local_3c = KINGetNumNonlinSolvIters(retvalvalue_01,&nni);
                  check_retval(&local_3c,"KINGetNumNonlinSolvIters",1);
                  local_3c = KINGetNumFuncEvals(retvalvalue_01,&nfe);
                  check_retval(&local_3c,"KINGetNumFuncEvals",1);
                  puts("\nFinal Statistics.. \n");
                  printf("nni      = %6ld    nfe     = %6ld \n",nni,nfe);
                  plVar4 = (long *)N_VClone(retvalvalue);
                  uVar5 = N_VClone(retvalvalue);
                  puVar2 = *(undefined4 **)(*plVar4 + 0x10);
                  *puVar2 = 0x778c1b68;
                  puVar2[1] = 0x3fefe5aa;
                  puVar2[2] = 0x13781b22;
                  puVar2[3] = 0x3f6830e7;
                  *(undefined8 *)(puVar2 + 4) = 0x3f31250b0363ecab;
                  N_VAbs(plVar4,uVar5);
                  N_VScale(0xeb1c432d,uVar5,uVar5);
                  N_VAddConst(0xa0b5ed8d,uVar5,uVar5);
                  dVar8 = (double)N_VMin(uVar5);
                  if (dVar8 <= 0.0) {
                    fwrite("\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n",0x2e,1,_stderr);
                    uVar7 = 0xffffffff;
                  }
                  else {
                    N_VInv(uVar5,uVar5);
                    N_VLinearSum(0,0xbff0000000000000,retvalvalue,plVar4,plVar4);
                    dVar8 = (double)N_VWrmsNorm(plVar4,uVar5);
                    if (1.0 <= dVar8) {
                      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
                    }
                    uVar7 = (uint)(1.0 <= dVar8);
                    N_VDestroy(plVar4);
                    N_VDestroy(uVar5);
                  }
                  retval = uVar7;
                  N_VDestroy(retvalvalue);
                  N_VDestroy(retvalvalue_00);
                  KINFree(&local_50);
                  SUNContext_Free(&sunctx);
                  iVar6 = retval;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;

  fnorm = 0.0;
  y = scale = NULL;
  kmem      = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Example problem from chemical kinetics solving\n");
  printf("the first time step in a Backward Euler solution for the\n");
  printf("following three rate equations:\n");
  printf("    dy1/dt = -.04*y1 + 1.e4*y2*y3\n");
  printf("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2\n");
  printf("    dy3/dt = 3.e2*(y2)^2\n");
  printf("on the interval from t = 0.0 to t = 0.1, with initial\n");
  printf("conditions: y1 = 1.0, y2 = y3 = 0.\n");
  printf("Solution method: Anderson accelerated fixed point iteration.\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, PRIORS);

  retval = KINInit(kmem, funcRoberts, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = TOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  Ith(y, 1) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  y,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* check the solution error */
  retval = check_ans(y, SUN_RCONST(1e-4), SUN_RCONST(1e-6));

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNContext_Free(&sunctx);

  return (retval);
}